

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnLocalDecl
          (BinaryReaderLogging *this,Index decl_index,Index count,Type type)

{
  Stream *this_00;
  uint uVar1;
  uint uVar2;
  Enum EVar3;
  undefined8 uVar4;
  string local_48;
  uint local_28;
  uint local_24;
  Index count_local;
  Index decl_index_local;
  BinaryReaderLogging *this_local;
  Type type_local;
  
  local_28 = count;
  local_24 = decl_index;
  _count_local = this;
  unique0x100000d6 = type;
  WriteIndent(this);
  uVar2 = local_24;
  uVar1 = local_28;
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_48,(Type *)((long)&this_local + 4));
  uVar4 = std::__cxx11::string::c_str();
  Stream::Writef(this_00,"OnLocalDecl(index: %u, count: %u, type: %s)\n",(ulong)uVar2,(ulong)uVar1,
                 uVar4);
  std::__cxx11::string::~string((string *)&local_48);
  EVar3 = (*this->reader_->_vptr_BinaryReaderDelegate[0x36])
                    (this->reader_,(ulong)local_24,(ulong)local_28,stack0xffffffffffffffec);
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderLogging::OnLocalDecl(Index decl_index,
                                        Index count,
                                        Type type) {
  LOGF("OnLocalDecl(index: %" PRIindex ", count: %" PRIindex ", type: %s)\n",
       decl_index, count, type.GetName().c_str());
  return reader_->OnLocalDecl(decl_index, count, type);
}